

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  char cVar4;
  FilePath *in_RDI;
  FilePath result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_30,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pcVar1 = ((local_30.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,
             pcVar1 + (local_30.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  _Var2._M_p = local_70._M_dataplus._M_p;
  _Var3._M_p = local_70._M_dataplus._M_p;
  if (local_70._M_string_length != 0) {
    do {
      cVar4 = *_Var3._M_p;
      if (((cVar4 != '/') || (cVar4 = '/', _Var2._M_p == local_70._M_dataplus._M_p)) ||
         (_Var2._M_p[-1] != '/')) {
        *_Var2._M_p = cVar4;
        _Var2._M_p = _Var2._M_p + 1;
      }
      _Var3._M_p = _Var3._M_p + 1;
    } while (_Var3._M_p != local_70._M_dataplus._M_p + local_70._M_string_length);
  }
  local_70._M_string_length = (long)_Var2._M_p - (long)local_70._M_dataplus._M_p;
  *_Var2._M_p = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  FilePath::RemoveDirectoryName(in_RDI,(FilePath *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS || GTEST_OS_OS2
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}